

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

uint32_t __thiscall
cfd::core::ConfidentialTransaction::GetTxOutIndex
          (ConfidentialTransaction *this,Script *locking_script)

{
  pointer pCVar1;
  __type _Var2;
  CfdException *this_00;
  long lVar3;
  ulong uVar4;
  string search_str;
  Script local_88;
  string script;
  
  Script::GetHex_abi_cxx11_(&search_str,locking_script);
  lVar3 = 0;
  uVar4 = 0;
  while( true ) {
    pCVar1 = (this->vout_).
             super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((((long)(this->vout_).
                super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) / 0xf8 & 0xffffffffU) <=
        uVar4) {
      local_88._vptr_Script = (_func_int **)0x231217;
      local_88.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x5c7;
      local_88.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = "GetTxOutIndex";
      logger::warn<>((CfdSourceLocation *)&local_88,"locking script is not found.");
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&local_88,"locking script is not found.",(allocator *)&script);
      CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&local_88);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    AbstractTxOut::GetLockingScript
              (&local_88,
               (AbstractTxOut *)((long)&(pCVar1->super_AbstractTxOut)._vptr_AbstractTxOut + lVar3));
    Script::GetHex_abi_cxx11_(&script,&local_88);
    Script::~Script(&local_88);
    _Var2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &script,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&search_str);
    ::std::__cxx11::string::~string((string *)&script);
    if (_Var2) break;
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0xf8;
  }
  ::std::__cxx11::string::~string((string *)&search_str);
  return (uint32_t)uVar4;
}

Assistant:

uint32_t ConfidentialTransaction::GetTxOutIndex(
    const Script &locking_script) const {
  std::string search_str = locking_script.GetHex();
  uint32_t index = 0;
  for (; index < static_cast<uint32_t>(vout_.size()); ++index) {
    std::string script = vout_[index].GetLockingScript().GetHex();
    if (script == search_str) {
      return index;
    }
  }
  warn(CFD_LOG_SOURCE, "locking script is not found.");
  throw CfdException(kCfdIllegalArgumentError, "locking script is not found.");
}